

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void __thiscall Parser::doExec(Parser *this)

{
  char cVar1;
  __pid_t _Var2;
  int iVar3;
  const_iterator cVar4;
  ostream *poVar5;
  ulong uVar6;
  size_t sVar7;
  int *piVar8;
  char *pcVar9;
  _Hash_node_base *p_Var10;
  string executable;
  key_type local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_88;
  path local_80;
  path local_58;
  
  p_Var10 = (this->toLaunch)._M_h._M_before_begin._M_nxt;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    local_88 = &(this->disabled)._M_h;
    do {
      stringSplit((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_80,(string *)(p_Var10 + 1),' ');
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,*(long *)local_80._M_pathname._M_dataplus._M_p,
                 *(long *)(local_80._M_pathname._M_dataplus._M_p + 8) +
                 *(long *)local_80._M_pathname._M_dataplus._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_80);
      cVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(local_88,&local_a8);
      if (cVar4.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_80,&local_a8,auto_format);
        cVar1 = std::filesystem::__cxx11::path::has_parent_path();
        if (cVar1 == '\0') {
          std::filesystem::__cxx11::path::~path(&local_80);
        }
        else {
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_58,&local_a8,auto_format);
          cVar1 = std::filesystem::status(&local_58);
          std::filesystem::__cxx11::path::~path(&local_58);
          std::filesystem::__cxx11::path::~path(&local_80);
          if ((cVar1 == -1) || (cVar1 == '\0')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ! ",3);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_a8._M_dataplus._M_p,
                                local_a8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," does not exist, ignoring",0x19);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            goto LAB_0010489a;
          }
        }
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_80,&local_a8,auto_format);
        cVar1 = std::filesystem::status(&local_80);
        std::filesystem::__cxx11::path::~path(&local_80);
        if ((cVar1 != '\0') && (cVar1 != -1)) {
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_80,&local_a8,auto_format);
          cVar1 = std::filesystem::status(&local_80);
          if (cVar1 == '\x01') {
            std::filesystem::__cxx11::path::~path(&local_80);
          }
          else {
            std::filesystem::__cxx11::path::
            path<std::__cxx11::string,std::filesystem::__cxx11::path>
                      (&local_58,&local_a8,auto_format);
            cVar1 = std::filesystem::symlink_status(&local_58);
            std::filesystem::__cxx11::path::~path(&local_58);
            std::filesystem::__cxx11::path::~path(&local_80);
            if (cVar1 != '\x03') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ! ",3);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_a8._M_dataplus._M_p,
                                  local_a8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," not a file",0xb);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
            }
          }
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_80,&local_a8,auto_format);
          uVar6 = std::filesystem::status(&local_80);
          std::filesystem::__cxx11::path::~path(&local_80);
          if ((uVar6 & 0x4900000000) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ! ",3);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_a8._M_dataplus._M_p,
                                local_a8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not executable",0x12);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
        }
        pcVar9 = (((string *)(p_Var10 + 1))->_M_dataplus)._M_p;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," -> Launching \'",0xf);
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c180);
        }
        else {
          sVar7 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        if (s_dryRun == '\0') {
          _Var2 = fork();
          if (_Var2 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr," ! Error forking: ",0x12);
            piVar8 = __errno_location();
            pcVar9 = strerror(*piVar8);
            if (pcVar9 == (char *)0x0) {
              poVar5 = (ostream *)&std::cerr;
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10c240);
            }
            else {
              sVar7 = strlen(pcVar9);
              poVar5 = (ostream *)&std::cerr;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar7)
              ;
            }
          }
          else {
            if (_Var2 == 0) {
              if (s_verbose == '\x01') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Child executing ",0x10);
                poVar5 = std::operator<<((ostream *)&std::cout,pcVar9);
                std::endl<char,std::char_traits<char>>(poVar5);
              }
              iVar3 = system(pcVar9);
              if ((iVar3 != 0) && (s_verbose == '\x01')) {
                perror("Launching failed");
              }
              exit(0);
            }
            if (s_verbose != '\x01') goto LAB_001048ad;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Forked, parent PID: ",0x14);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var2);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          goto LAB_0010489a;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," - Skipping disabled ",0x15);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)p_Var10[1]._M_nxt,(long)p_Var10[2]._M_nxt)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_0010489a:
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
LAB_001048ad:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void doExec() {
        for (const std::string &exec : toLaunch) {
            const std::string executable = stringSplit(exec)[0];
            if (disabled.count(executable)) {
                std::cout << " - Skipping disabled " << exec << std::endl;
                continue;
            }
            if (fs::path(executable).has_parent_path() && !fs::exists(executable)) {
                std::cerr << " ! " << executable << " does not exist, ignoring" << std::endl;
                continue;
            }
            if (fs::exists(executable)) {
                if (!fs::is_regular_file(executable) &&
                    !fs::is_symlink(executable)) {
                    std::cerr << " ! " << executable << " not a file" << std::endl;
                }
                fs::perms permissions = fs::status(executable).permissions();
                if ((permissions & execPermissions) == fs::perms::none) {
                    std::cerr << " ! " << executable << " is not executable" << std::endl;
                }

            }

            launch(exec.c_str());
        }
    }